

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

void __thiscall BVSparse<Memory::ArenaAllocator>::~BVSparse(BVSparse<Memory::ArenaAllocator> *this)

{
  Type pBVar1;
  Type buffer;
  
  buffer = this->head;
  while (buffer != (Type)0x0) {
    this->lastFoundIndex = (Type)0x0;
    pBVar1 = buffer->next;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&this->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,buffer,0x18
              );
    this->lastUsedNodePrevNextField = &this->head;
    buffer = pBVar1;
  }
  return;
}

Assistant:

BVSparse<TAllocator>::~BVSparse()
{
    BVSparseNode * curNode = this->head;
    while (curNode != nullptr)
    {
        curNode = this->DeleteNode(curNode);
    }
}